

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall Mask::MoveBack(Mask *this)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Mask *local_10;
  Mask *this_local;
  
  if (0 < (this->super_MobileElement).start_) {
    (this->super_MobileElement).start_ = (this->super_MobileElement).start_ + -1;
    (this->super_MobileElement).footprint_ = (this->super_MobileElement).footprint_ + 1;
    return;
  }
  local_10 = this;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Attempting to assign negative start position to Mask object \'",
                 &(this->super_MobileElement).name_);
  std::operator+(&local_30,&local_50,"\'.");
  std::runtime_error::runtime_error(this_00,(string *)&local_30);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Mask::MoveBack() {
  if (start_ > 0) {
    start_--;
    footprint_++;
  } else {
    throw std::runtime_error(
        "Attempting to assign negative start position to Mask object '" +
        name_ + "'.");
  }
}